

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O1

int AF_AActor_DamageMobj
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  AActor *target;
  AActor *inflictor;
  AActor *source;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  PClass *pPVar4;
  VMValue *pVVar5;
  char *pcVar6;
  bool bVar7;
  FName local_3c;
  DAngle local_38;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      target = (AActor *)(param->field_0).field_1.a;
      if (target != (AActor *)0x0) {
        if ((target->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar3 = (**(target->super_DThinker).super_DObject._vptr_DObject)(target);
          (target->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
        }
        pPVar4 = (target->super_DThinker).super_DObject.Class;
        bVar7 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar2 && bVar7) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar7 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar2) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (!bVar7) {
          pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003ff629;
        }
      }
      pPVar2 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) {
        pcVar6 = "(paramnum) < numparam";
      }
      else {
        if ((param[1].field_0.field_3.Type == '\x03') &&
           ((param[1].field_0.field_1.atag == 1 || (param[1].field_0.field_1.a == (void *)0x0)))) {
          inflictor = (AActor *)param[1].field_0.field_1.a;
          if (inflictor != (AActor *)0x0) {
            if ((inflictor->super_DThinker).super_DObject.Class == (PClass *)0x0) {
              iVar3 = (**(inflictor->super_DThinker).super_DObject._vptr_DObject)(inflictor);
              (inflictor->super_DThinker).super_DObject.Class =
                   (PClass *)CONCAT44(extraout_var_00,iVar3);
            }
            pPVar4 = (inflictor->super_DThinker).super_DObject.Class;
            bVar7 = pPVar4 != (PClass *)0x0;
            if (pPVar4 != pPVar2 && bVar7) {
              do {
                pPVar4 = pPVar4->ParentClass;
                bVar7 = pPVar4 != (PClass *)0x0;
                if (pPVar4 == pPVar2) break;
              } while (pPVar4 != (PClass *)0x0);
            }
            if (!bVar7) {
              pcVar6 = "inflictor == NULL || inflictor->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_003ff648;
            }
          }
          pPVar2 = AActor::RegistrationInfo.MyClass;
          if (numparam < 3) {
            pcVar6 = "(paramnum) < numparam";
          }
          else {
            if ((param[2].field_0.field_3.Type == '\x03') &&
               ((param[2].field_0.field_1.atag == 1 || (param[2].field_0.field_1.a == (void *)0x0)))
               ) {
              source = (AActor *)param[2].field_0.field_1.a;
              if (source != (AActor *)0x0) {
                if ((source->super_DThinker).super_DObject.Class == (PClass *)0x0) {
                  iVar3 = (**(source->super_DThinker).super_DObject._vptr_DObject)(source);
                  (source->super_DThinker).super_DObject.Class =
                       (PClass *)CONCAT44(extraout_var_01,iVar3);
                }
                pPVar4 = (source->super_DThinker).super_DObject.Class;
                bVar7 = pPVar4 != (PClass *)0x0;
                if (pPVar4 != pPVar2 && bVar7) {
                  do {
                    pPVar4 = pPVar4->ParentClass;
                    bVar7 = pPVar4 != (PClass *)0x0;
                    if (pPVar4 == pPVar2) break;
                  } while (pPVar4 != (PClass *)0x0);
                }
                if (!bVar7) {
                  pcVar6 = "source == NULL || source->IsKindOf(RUNTIME_CLASS(AActor))";
                  goto LAB_003ff667;
                }
              }
              if (numparam == 3) {
                pcVar6 = "(paramnum) < numparam";
              }
              else {
                if (param[3].field_0.field_3.Type == '\0') {
                  if (numparam < 5) {
                    pcVar6 = "(paramnum) < numparam";
                  }
                  else {
                    if (param[4].field_0.field_3.Type == '\0') {
                      pVVar1 = param + 3;
                      local_3c.Index = param[4].field_0.i;
                      if (numparam == 5) {
                        pVVar5 = defaultparam->Array;
                        if (defaultparam->Array[5].field_0.field_3.Type != '\0') {
                          pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ff6c4:
                          __assert_fail(pcVar6,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                                        ,0x635,
                                        "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                       );
                        }
                      }
                      else {
                        pVVar5 = param;
                        if (param[5].field_0.field_3.Type != '\0') {
                          pcVar6 = "(param[paramnum]).Type == REGT_INT";
                          goto LAB_003ff6c4;
                        }
                      }
                      if (numparam < 7) {
                        param = defaultparam->Array;
                        if (param[6].field_0.field_3.Type == '\x01') goto LAB_003ff52d;
                        pcVar6 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
                      }
                      else {
                        if (param[6].field_0.field_3.Type == '\x01') {
LAB_003ff52d:
                          local_38.Degrees = (double)param[6].field_0.field_1.a;
                          iVar3 = P_DamageMobj(target,inflictor,source,(pVVar1->field_0).i,&local_3c
                                               ,pVVar5[5].field_0.i,&local_38);
                          if (numret < 1) {
                            iVar3 = 0;
                          }
                          else {
                            if (ret == (VMReturn *)0x0) {
                              __assert_fail("ret != NULL",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                                            ,0x637,
                                            "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                           );
                            }
                            if (ret->RegType != '\0') {
                              __assert_fail("RegType == REGT_INT",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                                            ,0x13f,"void VMReturn::SetInt(int)");
                            }
                            *(int *)ret->Location = iVar3;
                            iVar3 = 1;
                          }
                          return iVar3;
                        }
                        pcVar6 = "(param[paramnum]).Type == REGT_FLOAT";
                      }
                      __assert_fail(pcVar6,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                                    ,0x636,
                                    "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                   );
                    }
                    pcVar6 = "param[paramnum].Type == REGT_INT";
                  }
                  __assert_fail(pcVar6,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                                ,0x634,
                                "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                pcVar6 = "param[paramnum].Type == REGT_INT";
              }
              __assert_fail(pcVar6,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                            ,0x633,
                            "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pcVar6 = 
            "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
            ;
          }
LAB_003ff667:
          __assert_fail(pcVar6,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                        ,0x632,
                        "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar6 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
      }
LAB_003ff648:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                    ,0x631,
                    "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003ff629:
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                ,0x630,
                "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, DamageMobj)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT(inflictor, AActor);
	PARAM_OBJECT(source, AActor);
	PARAM_INT(damage);
	PARAM_NAME(mod);
	PARAM_INT_DEF(flags);
	PARAM_FLOAT_DEF(angle);
	ACTION_RETURN_INT(P_DamageMobj(self, inflictor, source, damage, mod, flags, angle));
}